

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_edge.c
# Opt level: O1

REF_STATUS ref_edge_ghost_min_int(REF_EDGE ref_edge,REF_MPI ref_mpi,REF_INT *data)

{
  int iVar1;
  int iVar2;
  REF_INT *pRVar3;
  bool bVar4;
  REF_MPI pRVar5;
  void *__ptr;
  uint uVar6;
  uint uVar7;
  REF_INT *pRVar8;
  undefined4 extraout_var;
  long lVar9;
  void *pvVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  undefined8 uVar15;
  size_t sVar16;
  char *pcVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  REF_INT node1;
  REF_INT node0;
  int local_a8;
  int local_a4;
  REF_NODE local_a0;
  REF_INT *local_98;
  REF_STATUS local_8c;
  REF_INT local_88;
  REF_INT local_84;
  void *local_80;
  void *local_78;
  REF_INT *local_70;
  void *local_68;
  REF_MPI local_60;
  REF_INT *local_58;
  ulong local_50;
  void *local_48;
  int *local_40;
  void *local_38;
  
  if ((long)ref_mpi->n < 2) {
    return 0;
  }
  local_a0 = ref_edge->node;
  sVar16 = (long)ref_mpi->n << 2;
  local_58 = data;
  pRVar8 = (REF_INT *)malloc(sVar16);
  if (pRVar8 == (REF_INT *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",0x16d,
           "ref_edge_ghost_min_int","malloc a_size of REF_INT NULL");
    return 2;
  }
  memset(pRVar8,0,sVar16);
  iVar11 = ref_mpi->n;
  local_70 = pRVar8;
  if ((long)iVar11 < 0) {
    bVar4 = false;
    iVar11 = printf("%s: %d: %s: %s\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                    ,0x16e,"ref_edge_ghost_min_int","malloc b_size of REF_INT negative");
    local_98 = (REF_INT *)CONCAT44(extraout_var,iVar11);
    local_8c = 1;
  }
  else {
    sVar16 = (long)iVar11 * 4;
    local_98 = (REF_INT *)malloc(sVar16);
    if (local_98 == (REF_INT *)0x0) {
      bVar4 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",0x16e,
             "ref_edge_ghost_min_int","malloc b_size of REF_INT NULL");
      local_98 = (REF_INT *)0x0;
    }
    else {
      bVar4 = true;
      if (iVar11 != 0) {
        memset(local_98,0,sVar16);
      }
    }
    local_8c = 2;
  }
  if (!bVar4) {
    return local_8c;
  }
  iVar11 = ref_edge->n;
  local_60 = ref_mpi;
  if (iVar11 < 1) {
    iVar11 = 0;
  }
  else {
    iVar1 = ref_mpi->id;
    iVar18 = 0;
    do {
      ref_edge_part(ref_edge,iVar18,&local_a8);
      if (local_a8 != iVar1) {
        local_70[local_a8] = local_70[local_a8] + 1;
      }
      iVar18 = iVar18 + 1;
    } while (iVar11 != iVar18);
  }
  pRVar5 = local_60;
  pRVar8 = local_70;
  local_a4 = iVar11;
  uVar6 = ref_mpi_alltoall(local_60,local_70,local_98,1);
  if (uVar6 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",0x176,
           "ref_edge_ghost_min_int",(ulong)uVar6,"alltoall sizes");
    return uVar6;
  }
  iVar11 = pRVar5->n;
  lVar19 = (long)iVar11;
  if (lVar19 < 1) {
    uVar6 = 0;
    local_a8 = 0;
  }
  else {
    lVar9 = 0;
    uVar6 = 0;
    do {
      uVar6 = uVar6 + pRVar8[lVar9];
      lVar9 = lVar9 + 1;
      local_a8 = iVar11;
    } while (lVar19 != lVar9);
  }
  if ((int)uVar6 < 0) {
    pcVar17 = "malloc a_nodes of REF_GLOB negative";
    uVar15 = 0x17a;
    goto LAB_00145178;
  }
  pvVar10 = malloc((ulong)(uVar6 * 2) << 3);
  if (pvVar10 == (void *)0x0) {
    pcVar17 = "malloc a_nodes of REF_GLOB NULL";
    uVar15 = 0x17a;
  }
  else {
    local_48 = pvVar10;
    pvVar10 = malloc((ulong)uVar6 << 2);
    if (pvVar10 == (void *)0x0) {
      pcVar17 = "malloc a_data of REF_INT NULL";
      uVar15 = 0x17b;
    }
    else {
      local_68 = pvVar10;
      pvVar10 = malloc((ulong)uVar6 << 2);
      if (pvVar10 == (void *)0x0) {
        pcVar17 = "malloc a_edge of REF_INT NULL";
        uVar15 = 0x17c;
      }
      else {
        if (iVar11 < 1) {
          uVar20 = 0;
          local_a8 = 0;
        }
        else {
          lVar9 = 0;
          uVar20 = 0;
          do {
            uVar20 = (ulong)(uint)((int)uVar20 + local_98[lVar9]);
            lVar9 = lVar9 + 1;
            local_a8 = iVar11;
          } while (lVar19 != lVar9);
        }
        if ((int)uVar20 < 0) {
          pcVar17 = "malloc b_nodes of REF_GLOB negative";
          uVar15 = 0x180;
LAB_00145178:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",
                 uVar15,"ref_edge_ghost_min_int",pcVar17);
          return 1;
        }
        local_38 = pvVar10;
        local_80 = malloc((ulong)(uint)((int)uVar20 * 2) << 3);
        if (local_80 == (void *)0x0) {
          pcVar17 = "malloc b_nodes of REF_GLOB NULL";
          uVar15 = 0x180;
        }
        else {
          local_50 = uVar20;
          pvVar10 = malloc(uVar20 << 2);
          if (pvVar10 == (void *)0x0) {
            pcVar17 = "malloc b_data of REF_INT NULL";
            uVar15 = 0x181;
          }
          else {
            if (iVar11 < 0) {
              pcVar17 = "malloc a_next of REF_INT negative";
              uVar15 = 0x183;
              goto LAB_00145178;
            }
            local_78 = pvVar10;
            local_40 = (int *)malloc(lVar19 * 4);
            if (local_40 != (int *)0x0) {
              *local_40 = 0;
              lVar9 = 1;
              if (1 < iVar11) {
                iVar11 = *local_40;
                lVar9 = 1;
                do {
                  iVar11 = iVar11 + pRVar8[lVar9 + -1];
                  local_40[lVar9] = iVar11;
                  lVar9 = lVar9 + 1;
                } while (lVar19 != lVar9);
              }
              local_a8 = (int)lVar9;
              iVar11 = ref_edge->n;
              if ((long)iVar11 < 1) {
                lVar19 = 0;
              }
              else {
                iVar1 = local_60->id;
                lVar19 = 0;
                do {
                  ref_edge_part(ref_edge,(REF_INT)lVar19,&local_a8);
                  if (local_a8 != iVar1) {
                    iVar18 = local_40[local_a8];
                    lVar12 = (long)iVar18;
                    *(REF_INT *)((long)local_38 + lVar12 * 4) = (REF_INT)lVar19;
                    *(REF_INT *)((long)local_68 + lVar12 * 4) = local_58[lVar19];
                    pRVar3 = ref_edge->e2n;
                    iVar2 = pRVar3[lVar19 * 2];
                    lVar14 = -1;
                    lVar9 = -1;
                    if (((-1 < (long)iVar2) && (iVar2 < local_a0->max)) &&
                       (lVar9 = local_a0->global[iVar2], lVar9 < 0)) {
                      lVar9 = -1;
                    }
                    *(long *)((long)local_48 + lVar12 * 0x10) = lVar9;
                    iVar2 = pRVar3[lVar19 * 2 + 1];
                    if (((-1 < (long)iVar2) && (iVar2 < local_a0->max)) &&
                       (lVar14 = local_a0->global[iVar2], lVar14 < 0)) {
                      lVar14 = -1;
                    }
                    *(long *)((long)local_48 + (long)(int)(iVar18 * 2 | 1) * 8) = lVar14;
                    local_40[local_a8] = iVar18 + 1;
                  }
                  lVar19 = lVar19 + 1;
                } while (iVar11 != lVar19);
              }
              pRVar5 = local_60;
              local_a4 = (int)lVar19;
              uVar7 = ref_mpi_alltoallv(local_60,local_48,pRVar8,local_80,local_98,2,2);
              if (uVar7 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                       ,0x197,"ref_edge_ghost_min_int",(ulong)uVar7,"alltoallv requested nodes");
                return uVar7;
              }
              uVar7 = ref_mpi_alltoallv(pRVar5,local_68,pRVar8,local_78,local_98,1,1);
              if (uVar7 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                       ,0x19a,"ref_edge_ghost_min_int",(ulong)uVar7,"alltoallv requested data");
                return uVar7;
              }
              if ((int)local_50 != 0) {
                uVar20 = 1;
                if (1 < (int)local_50) {
                  uVar20 = local_50 & 0xffffffff;
                }
                lVar19 = 0;
                do {
                  uVar7 = ref_node_local(local_a0,*(REF_GLOB *)((long)local_80 + lVar19 * 4),
                                         &local_84);
                  if (uVar7 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                           ,0x19e,"ref_edge_ghost_min_int",(ulong)uVar7,"loc 0");
                    return uVar7;
                  }
                  uVar7 = ref_node_local(local_a0,*(REF_GLOB *)((long)local_80 + lVar19 * 4 + 8),
                                         &local_88);
                  if (uVar7 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                           ,0x19f,"ref_edge_ghost_min_int",(ulong)uVar7,"loc 1");
                    return uVar7;
                  }
                  uVar7 = ref_edge_with(ref_edge,local_84,local_88,&local_a4);
                  if (uVar7 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                           ,0x1a0,"ref_edge_ghost_min_int",(ulong)uVar7,"find edge");
                    return uVar7;
                  }
                  iVar11 = local_58[local_a4];
                  if (*(int *)((long)local_78 + lVar19) < local_58[local_a4]) {
                    iVar11 = *(int *)((long)local_78 + lVar19);
                  }
                  local_58[local_a4] = iVar11;
                  lVar19 = lVar19 + 4;
                } while (uVar20 * 4 != lVar19);
              }
              if ((int)local_50 != 0) {
                uVar20 = 1;
                if (1 < (int)local_50) {
                  uVar20 = local_50 & 0xffffffff;
                }
                lVar19 = 0;
                do {
                  uVar7 = ref_node_local(local_a0,*(REF_GLOB *)((long)local_80 + lVar19 * 4),
                                         &local_84);
                  if (uVar7 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                           ,0x1a5,"ref_edge_ghost_min_int",(ulong)uVar7,"loc 0");
                    return uVar7;
                  }
                  uVar7 = ref_node_local(local_a0,*(REF_GLOB *)((long)local_80 + lVar19 * 4 + 8),
                                         &local_88);
                  if (uVar7 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                           ,0x1a6,"ref_edge_ghost_min_int",(ulong)uVar7,"loc 1");
                    return uVar7;
                  }
                  uVar7 = ref_edge_with(ref_edge,local_84,local_88,&local_a4);
                  if (uVar7 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                           ,0x1a7,"ref_edge_ghost_min_int",(ulong)uVar7,"find edge");
                    return uVar7;
                  }
                  *(REF_INT *)((long)local_78 + lVar19) = local_58[local_a4];
                  lVar19 = lVar19 + 4;
                } while (uVar20 * 4 != lVar19);
              }
              uVar7 = ref_mpi_alltoallv(local_60,local_78,local_98,local_68,local_70,1,1);
              __ptr = local_38;
              pvVar10 = local_68;
              if (uVar7 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                       ,0x1ad,"ref_edge_ghost_min_int",(ulong)uVar7,"alltoallv return data");
                return uVar7;
              }
              if (uVar6 != 0) {
                uVar20 = 1;
                if (1 < (int)uVar6) {
                  uVar20 = (ulong)uVar6;
                }
                uVar13 = 0;
                do {
                  local_58[*(int *)((long)local_38 + uVar13 * 4)] =
                       *(REF_INT *)((long)local_68 + uVar13 * 4);
                  uVar13 = uVar13 + 1;
                } while (uVar20 != uVar13);
              }
              free(local_40);
              free(local_78);
              free(local_80);
              free(__ptr);
              free(pvVar10);
              free(local_48);
              if (local_98 != (REF_INT *)0x0) {
                free(local_98);
              }
              if (local_70 != (REF_INT *)0x0) {
                free(local_70);
                return 0;
              }
              return 0;
            }
            pcVar17 = "malloc a_next of REF_INT NULL";
            uVar15 = 0x183;
          }
        }
      }
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",uVar15,
         "ref_edge_ghost_min_int",pcVar17);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_edge_ghost_min_int(REF_EDGE ref_edge, REF_MPI ref_mpi,
                                          REF_INT *data) {
  REF_NODE ref_node = ref_edge_node(ref_edge);
  REF_INT *a_size, *b_size;
  REF_INT a_total, b_total;
  REF_INT edge;
  REF_INT part;
  REF_INT *a_next, *a_edge;
  REF_GLOB *a_nodes, *b_nodes;
  REF_INT *a_data, *b_data;

  REF_INT node0, node1;
  REF_INT request;

  if (!ref_mpi_para(ref_mpi)) return REF_SUCCESS;

  ref_malloc_init(a_size, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_size, ref_mpi_n(ref_mpi), REF_INT, 0);

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
    if (part != ref_mpi_rank(ref_mpi)) a_size[part]++;
  }

  RSS(ref_mpi_alltoall(ref_mpi, a_size, b_size, REF_INT_TYPE),
      "alltoall sizes");

  a_total = 0;
  each_ref_mpi_part(ref_mpi, part) a_total += a_size[part];
  ref_malloc(a_nodes, 2 * a_total, REF_GLOB);
  ref_malloc(a_data, a_total, REF_INT);
  ref_malloc(a_edge, a_total, REF_INT);

  b_total = 0;
  each_ref_mpi_part(ref_mpi, part) b_total += b_size[part];
  ref_malloc(b_nodes, 2 * b_total, REF_GLOB);
  ref_malloc(b_data, b_total, REF_INT);

  ref_malloc(a_next, ref_mpi_n(ref_mpi), REF_INT);
  a_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) a_next[part] =
      a_next[part - 1] + a_size[part - 1];

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
    if (part != ref_mpi_rank(ref_mpi)) {
      a_edge[a_next[part]] = edge;
      a_data[a_next[part]] = data[edge];
      a_nodes[0 + 2 * a_next[part]] =
          ref_node_global(ref_node, ref_edge_e2n(ref_edge, 0, edge));
      a_nodes[1 + 2 * a_next[part]] =
          ref_node_global(ref_node, ref_edge_e2n(ref_edge, 1, edge));
      (a_next[part])++;
    }
  }

  RSS(ref_mpi_alltoallv(ref_mpi, a_nodes, a_size, b_nodes, b_size, 2,
                        REF_GLOB_TYPE),
      "alltoallv requested nodes");
  RSS(ref_mpi_alltoallv(ref_mpi, a_data, a_size, b_data, b_size, 1,
                        REF_INT_TYPE),
      "alltoallv requested data");

  /* min local data with remote ghost data */
  for (request = 0; request < b_total; request++) {
    RSS(ref_node_local(ref_node, b_nodes[0 + 2 * request], &node0), "loc 0");
    RSS(ref_node_local(ref_node, b_nodes[1 + 2 * request], &node1), "loc 1");
    RSS(ref_edge_with(ref_edge, node0, node1, &edge), "find edge");
    data[edge] = MIN(b_data[request], data[edge]);
  }
  /* export local consistent data */
  for (request = 0; request < b_total; request++) {
    RSS(ref_node_local(ref_node, b_nodes[0 + 2 * request], &node0), "loc 0");
    RSS(ref_node_local(ref_node, b_nodes[1 + 2 * request], &node1), "loc 1");
    RSS(ref_edge_with(ref_edge, node0, node1, &edge), "find edge");
    b_data[request] = data[edge];
  }

  RSS(ref_mpi_alltoallv(ref_mpi, b_data, b_size, a_data, a_size, 1,
                        REF_INT_TYPE),
      "alltoallv return data");

  for (request = 0; request < a_total; request++) {
    data[a_edge[request]] = a_data[request];
  }

  ref_free(a_next);

  ref_free(b_data);
  ref_free(b_nodes);

  ref_free(a_edge);

  ref_free(a_data);
  ref_free(a_nodes);

  ref_free(b_size);
  ref_free(a_size);

  return REF_SUCCESS;
}